

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldpc.c
# Opt level: O1

void ldpc_generate_mat(m256v *L,parameters *P)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  
  m256v_clear(L);
  if (0 < P->B) {
    uVar5 = 0;
    do {
      iVar1 = P->S;
      uVar2 = (ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff;
      uVar3 = (long)uVar2 % (long)iVar1;
      L->e[uVar5 + L->rstride * (uVar3 & 0xffffffff)] = '\x01';
      iVar1 = (int)((long)uVar2 / (long)iVar1);
      iVar6 = ((int)uVar3 + iVar1 + 1) % P->S;
      L->e[uVar5 + L->rstride * (long)iVar6] = '\x01';
      L->e[uVar5 + (long)((iVar6 + iVar1 + 1) % P->S) * L->rstride] = '\x01';
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < (long)P->B);
  }
  if (0 < P->S) {
    lVar4 = 0;
    do {
      L->e[P->B + lVar4 + L->rstride * lVar4] = '\x01';
      lVar4 = lVar4 + 1;
    } while (lVar4 < P->S);
  }
  if (0 < P->S) {
    uVar5 = 0;
    do {
      iVar1 = P->P;
      uVar2 = uVar5 + 1;
      L->e[(long)(int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) %
                      (long)iVar1) + (long)P->W + L->rstride * uVar5] = '\x01';
      L->e[(long)(int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) %
                      (long)iVar1) + (long)P->W + uVar5 * L->rstride] = '\x01';
      uVar5 = uVar2;
    } while ((long)uVar2 < (long)P->S);
  }
  return;
}

Assistant:

void ldpc_generate_mat(m256v* L, const parameters* P)
{
	assert(L->n_row == P->S);
	assert(L->n_col == P->L);

	m256v_clear(L);

	/* Fill in the left part (G_LDPC,1) */
	for (int i = 0; i < P->B; ++i) {
		const int a = 1 + i / P->S;
		int b = i % P->S;
		m256v_set_el(L, b, i, 1);
		b = (b + a) % P->S;
		m256v_set_el(L, b, i, 1);
		b = (b + a) % P->S;
		m256v_set_el(L, b, i, 1);
	}

	/* Add diagonal at offset B */
	for (int i = 0; i < P->S; ++i) {
		m256v_set_el(L, i, i + P->B, 1);
	}

	/* Double diagonal on the right (G_LDPC,2) */
	for (int i = 0; i < P->S; ++i) {
		const int a = i % P->P;
		const int b = (i + 1) % P->P;
		m256v_set_el(L, i, P->W + a, 1);
		m256v_set_el(L, i, P->W + b, 1);
	}
}